

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
do_remove(tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          *this,key_type k,bool bypass_verifier)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  const_reference pvVar4;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  AssertHelper local_348;
  Message local_340;
  unsigned_long local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_9;
  __int_type leaf_count_after;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_8;
  __int_type mem_use_after;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  Message local_140;
  __int_type local_138;
  __int_type key_prefix_splits_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> shrinking_inodes_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> growing_inodes_before;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  __int_type mem_use_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> node_counts_before;
  AssertHelper local_68;
  Message local_60 [3];
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  size_type local_28;
  size_type remove_result;
  char *pcStack_18;
  bool bypass_verifier_local;
  key_type k_local;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  remove_result._7_1_ = bypass_verifier;
  pcStack_18 = (char *)k;
  k_local = (key_type)this;
  if (!bypass_verifier) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )to_ikey(this,k);
    local_28 = std::
               map<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ::erase(&this->values,(key_type *)&gtest_ar.message_);
    local_44 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_40,"(remove_result)","(1)",&local_28,&local_44);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
    if (!bVar1) {
      testing::Message::Message(local_60);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x121,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      testing::Message::~Message(local_60);
    }
    node_counts_before._M_elems[4]._5_3_ = 0;
    node_counts_before._M_elems[4]._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
    if (node_counts_before._M_elems[4]._4_4_ != 0) {
      return;
    }
  }
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> *)&mem_use_before
             ,&this->test_db);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
         get_current_memory_use(&this->test_db);
  pvVar4 = std::array<unsigned_long,_5UL>::operator[]
                     ((array<unsigned_long,_5UL> *)&mem_use_before,0);
  local_b4 = 0;
  testing::internal::CmpHelperGT<unsigned_long,int>
            ((internal *)local_b0,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",pvVar4,
             &local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x127,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  node_counts_before._M_elems[4]._5_3_ = 0;
  node_counts_before._M_elems[4]._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (node_counts_before._M_elems[4]._4_4_ == 0) {
    local_dc = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)local_d8,"(mem_use_before)","(0)",(unsigned_long *)&gtest_ar_1.message_,
               &local_dc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(growing_inodes_before._M_elems + 3),&local_e8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)(growing_inodes_before._M_elems + 3));
      testing::Message::~Message(&local_e8);
    }
    node_counts_before._M_elems[4]._5_3_ = 0;
    node_counts_before._M_elems[4]._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (node_counts_before._M_elems[4]._4_4_ == 0) {
      this_00 = &this->test_db;
      olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
      get_growing_inode_counts
                ((non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> *)
                 (shrinking_inodes_before._M_elems + 3),this_00);
      olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
      get_shrinking_inode_counts
                ((non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> *)
                 &key_prefix_splits_before,this_00);
      local_138 = olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                  get_key_prefix_splits(this_00);
      uVar2 = olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::remove
                        (this_00,pcStack_18);
      if ((uVar2 & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"test_db.remove failed for ");
        unodb::detail::dump_key<unsigned_long>((ostream *)&std::cerr,(unsigned_long)pcStack_18);
        std::operator<<((ostream *)&std::cerr,'\n');
        olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
                  (&this->test_db,(ostream *)&std::cerr);
        testing::Message::Message(&local_140);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x135,"Failed");
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_140);
      }
      else if ((this->parallel_test & 1U) == 0) {
        gtest_ar_8.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
               get_current_memory_use(&this->test_db);
        testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                  ((internal *)local_308,"(mem_use_after)","(mem_use_before)",
                   (unsigned_long *)&gtest_ar_8.message_,(unsigned_long *)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
        if (!bVar1) {
          testing::Message::Message(&local_310);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&leaf_count_after,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x14c,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&leaf_count_after,&local_310);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_count_after);
          testing::Message::~Message(&local_310);
        }
        node_counts_before._M_elems[4]._5_3_ = 0;
        node_counts_before._M_elems[4]._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
        if (node_counts_before._M_elems[4]._4_4_ == 0) {
          gtest_ar_9.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                 get_node_count<(unodb::node_type)0>(&this->test_db);
          pvVar4 = std::array<unsigned_long,_5UL>::operator[]
                             ((array<unsigned_long,_5UL> *)&mem_use_before,0);
          local_338 = *pvVar4 - 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_330,"(leaf_count_after)",
                     "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",
                     (unsigned_long *)&gtest_ar_9.message_,&local_338);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
          if (!bVar1) {
            testing::Message::Message(&local_340);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
            testing::internal::AssertHelper::AssertHelper
                      (&local_348,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                       ,0x151,pcVar3);
            testing::internal::AssertHelper::operator=(&local_348,&local_340);
            testing::internal::AssertHelper::~AssertHelper(&local_348);
            testing::Message::~Message(&local_340);
          }
          node_counts_before._M_elems[4]._5_3_ = 0;
          node_counts_before._M_elems[4]._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
        }
      }
    }
  }
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }